

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O0

double * r8vec_uniform_01_new(int n,int *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *r;
  int k;
  int i4_huge;
  int i;
  int *seed_local;
  int n_local;
  
  if (*seed == 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"R8VEC_UNIFORM_01_NEW - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
    exit(1);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (k = 0; k < n; k = k + 1) {
    *seed = *seed * 0x41a7 + (*seed / 0x1f31d) * -0x7fffffff;
    if (*seed < 0) {
      *seed = *seed + 0x7fffffff;
    }
    pdVar3[k] = (double)*seed * 4.656612875e-10;
  }
  return pdVar3;
}

Assistant:

double *r8vec_uniform_01_new ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_UNIFORM_01_NEW returns a new unit pseudorandom R8VEC.
//
//  Discussion:
//
//    This routine implements the recursion
//
//      seed = ( 16807 * seed ) mod ( 2^31 - 1 )
//      u = seed / ( 2^31 - 1 )
//
//    The integer arithmetic never requires more than 32 bits,
//    including a sign bit.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    19 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Paul Bratley, Bennett Fox, Linus Schrage,
//    A Guide to Simulation,
//    Second Edition,
//    Springer, 1987,
//    ISBN: 0387964673,
//    LC: QA76.9.C65.B73.
//
//    Bennett Fox,
//    Algorithm 647:
//    Implementation and Relative Efficiency of Quasirandom
//    Sequence Generators,
//    ACM Transactions on Mathematical Software,
//    Volume 12, Number 4, December 1986, pages 362-376.
//
//    Pierre L'Ecuyer,
//    Random Number Generation,
//    in Handbook of Simulation,
//    edited by Jerry Banks,
//    Wiley, 1998,
//    ISBN: 0471134031,
//    LC: T57.62.H37.
//
//    Peter Lewis, Allen Goodman, James Miller,
//    A Pseudo-Random Number Generator for the System/360,
//    IBM Systems Journal,
//    Volume 8, Number 2, 1969, pages 136-143.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double R8VEC_UNIFORM_01_NEW[N], the vector of pseudorandom values.
//
{
  int i;
  int i4_huge = 2147483647;
  int k;
  double *r;

  if ( seed == 0 )
  {
    std::cerr << "\n";
    std::cerr << "R8VEC_UNIFORM_01_NEW - Fatal error!\n";
    std::cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }

  r = new double[n];

  for ( i = 0; i < n; i++ )
  {
    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + i4_huge;
    }

    r[i] = double( seed ) * 4.656612875E-10;
  }

  return r;
}